

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

boolean goodpos(level *lev,int x,int y,monst *mtmp,uint gpflags)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  bool bVar4;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  monst *local_50;
  monst *mtmp2;
  permonst *ppStack_38;
  boolean ignorewater;
  permonst *mdat;
  uint gpflags_local;
  monst *mtmp_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  ppStack_38 = (permonst *)0x0;
  bVar4 = (gpflags & 0x80) == 0;
  if ((((x < 1) || (0x4f < x)) || (y < 0)) || (0x14 < y)) {
    return '\0';
  }
  if (((mtmp != &youmonst) && (x == u.ux)) &&
     ((y == u.uy && ((u.usteed == (monst *)0x0 || (mtmp != u.usteed)))))) {
    return '\0';
  }
  if (mtmp != (monst *)0x0) {
    if ((lev->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&lev->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_50 = (monst *)0x0;
    }
    else {
      local_50 = lev->monsters[x][y];
    }
    if ((local_50 != (monst *)0x0) && ((local_50 != mtmp || (mtmp->wormno != '\0')))) {
      return '\0';
    }
    ppStack_38 = mtmp->data;
    bVar1 = is_pool(lev,x,y);
    if ((bVar1 != '\0') && (bVar4)) {
      if (mtmp != &youmonst) {
        local_53 = true;
        if (((ppStack_38->mflags1 & 1) == 0) && (local_53 = true, (ppStack_38->mflags1 & 2) == 0)) {
          local_53 = (ppStack_38->mflags1 & 0x10) != 0;
        }
        return local_53;
      }
      local_51 = true;
      if ((((u.uprops[0x12].intrinsic == 0) && (local_51 = true, u.uprops[0x3c].extrinsic == 0)) &&
          (local_51 = true, ((youmonst.data)->mflags1 & 1) == 0)) &&
         ((u.usteed == (monst *)0x0 || (local_51 = true, ((u.usteed)->data->mflags1 & 1) == 0)))) {
        if ((u.uprops[0x27].extrinsic != 0) &&
           (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
          return '\x01';
        }
        local_51 = true;
        if (((u.uprops[0x39].intrinsic == 0) && (local_51 = true, u.uprops[0x39].extrinsic == 0)) &&
           ((local_51 = true, ((youmonst.data)->mflags1 & 2) == 0 &&
            ((u.usteed == (monst *)0x0 || (local_51 = true, ((u.usteed)->data->mflags1 & 2) == 0))))
           )) {
          local_52 = true;
          if ((u.uprops[0x31].intrinsic == 0) && (local_52 = true, u.uprops[0x31].extrinsic == 0)) {
            local_52 = ((youmonst.data)->mflags1 & 0x600) != 0;
          }
          local_51 = local_52;
        }
      }
      return local_51;
    }
    if (((ppStack_38->mlet == '9') && (iVar2 = rn2(0xd), iVar2 != 0)) && (bVar4)) {
      return '\0';
    }
    bVar1 = is_lava(lev,x,y);
    if (bVar1 != '\0') {
      if (mtmp != &youmonst) {
        local_54 = true;
        if ((ppStack_38->mflags1 & 1) == 0) {
          local_55 = ppStack_38 == mons + 0xa0 || ppStack_38 == mons + 0x157;
          local_54 = local_55;
        }
        return local_54;
      }
      return u.uprops[0x12].intrinsic != 0;
    }
    if (((ppStack_38->mflags1 & 8) != 0) &&
       (bVar1 = may_passwall(lev,(xchar)x,(xchar)y), bVar1 != '\0')) {
      return '\x01';
    }
  }
  if ((lev->locations[x][y].typ < '\x17') && ((bVar1 = is_pool(lev,x,y), bVar1 == '\0' || (bVar4))))
  {
    lev_local._7_1_ = '\0';
  }
  else {
    bVar1 = closed_door(lev,x,y);
    if ((bVar1 == '\0') || ((ppStack_38 != (permonst *)0x0 && ((ppStack_38->mflags1 & 4) != 0)))) {
      poVar3 = sobj_at(0x214,lev,x,y);
      if ((poVar3 == (obj *)0x0) ||
         ((ppStack_38 != (permonst *)0x0 && ((ppStack_38->mflags2 & 0x8000000) != 0)))) {
        lev_local._7_1_ = '\x01';
      }
      else {
        lev_local._7_1_ = '\0';
      }
    }
    else {
      lev_local._7_1_ = '\0';
    }
  }
  return lev_local._7_1_;
}

Assistant:

boolean goodpos(struct level *lev, int x, int y, struct monst *mtmp, unsigned gpflags)
{
	const struct permonst *mdat = NULL;
	boolean ignorewater = ((gpflags & MM_IGNOREWATER) != 0);

	if (!isok(x, y)) return FALSE;

	/* in many cases, we're trying to create a new monster, which
	 * can't go on top of the player or any existing monster.
	 * however, occasionally we are relocating engravings or objects,
	 * which could be co-located and thus get restricted a bit too much.
	 * oh well.
	 */
	if (mtmp != &youmonst && x == u.ux && y == u.uy
			&& (!u.usteed || mtmp != u.usteed))
		return FALSE;

	if (mtmp) {
	    struct monst *mtmp2 = m_at(lev, x,y);

	    /* Be careful with long worms.  A monster may be placed back in
	     * its own location.  Normally, if m_at() returns the same monster
	     * that we're trying to place, the monster is being placed in its
	     * own location.  However, that is not correct for worm segments,
	     * because all the segments of the worm return the same m_at().
	     * Actually we overdo the check a little bit--a worm can't be placed
	     * in its own location, period.  If we just checked for mtmp->mx
	     * != x || mtmp->my != y, we'd miss the case where we're called
	     * to place the worm segment and the worm's head is at x,y.
	     */
	    if (mtmp2 && (mtmp2 != mtmp || mtmp->wormno))
		return FALSE;

	    mdat = mtmp->data;
	    if (is_pool(lev, x,y) && !ignorewater) {
		if (mtmp == &youmonst)
			return !!(HLevitation || Flying || Wwalking ||
					Swimming || Amphibious);
		else	return (is_flyer(mdat) || is_swimmer(mdat) ||
							is_clinger(mdat));
	    } else if (mdat->mlet == S_EEL && rn2(13) && !ignorewater) {
		return FALSE;
	    } else if (is_lava(lev, x,y)) {
		if (mtmp == &youmonst)
		    return !!HLevitation;
		else
		    return is_flyer(mdat) || likes_lava(mdat);
	    }
	    if (passes_walls(mdat) && may_passwall(lev, x,y)) return TRUE;
	}
	if (!ACCESSIBLE(lev->locations[x][y].typ)) {
		if (!(is_pool(lev, x,y) && ignorewater)) return FALSE;
	}

	if (closed_door(lev, x, y) && (!mdat || !amorphous(mdat)))
		return FALSE;
	if (sobj_at(BOULDER, lev, x, y) && (!mdat || !throws_rocks(mdat)))
		return FALSE;
	return TRUE;
}